

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::triDerivateY(Vec3 *s,Vec3 *w,float wy,float height,float nx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float *pfVar12;
  float fVar13;
  float d;
  float nx_local;
  float height_local;
  float wy_local;
  Vec3 *w_local;
  Vec3 *s_local;
  
  pfVar12 = tcu::Vector<float,_3>::operator[](w,1);
  fVar1 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,2);
  fVar2 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,0);
  fVar3 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,1);
  fVar4 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,2);
  fVar13 = fVar1 * fVar2 * (height * (nx - 1.0) + wy) +
           -(fVar3 * (fVar4 * height * nx + *pfVar12 * wy));
  pfVar12 = tcu::Vector<float,_3>::operator[](w,0);
  fVar1 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,1);
  fVar2 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,2);
  fVar3 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,2);
  fVar4 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,0);
  fVar5 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,1);
  fVar6 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,0);
  fVar7 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,1);
  fVar8 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,2);
  fVar9 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](w,1);
  fVar10 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,2);
  fVar11 = *pfVar12;
  pfVar12 = tcu::Vector<float,_3>::operator[](s,0);
  return (fVar1 * fVar2 * fVar3 * height *
         (fVar4 * (fVar5 - fVar6) * (nx - 1.0) +
         nx * (fVar7 * (fVar8 - fVar9) + fVar10 * (fVar11 - *pfVar12)))) / (fVar13 * fVar13);
}

Assistant:

static inline float triDerivateY (const tcu::Vec3& s, const tcu::Vec3& w, float wy, float height, float nx)
{
	float d = w[1]*w[2]*(height*(nx - 1.0f) + wy) - w[0]*(w[1]*height*nx + w[2]*wy);
	return (w[0]*w[1]*w[2]*height * (w[2]*(s[0] - s[1])*(nx - 1.0f) + nx*(w[0]*(s[1] - s[2]) + w[1]*(s[2] - s[0])))) / (d*d);
}